

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interpreter.cpp
# Opt level: O2

Value * __thiscall
ot::commissioner::Interpreter::ProcessNetworkDiag
          (Value *__return_storage_ptr__,Interpreter *this,Expression *aExpr)

{
  ErrorCode EVar1;
  Value *pVVar2;
  Interpreter *this_00;
  CommissionerAppPtr commissioner;
  CommissionerAppPtr local_a8;
  undefined1 local_90 [40];
  
  (__return_storage_ptr__->mError).mCode = kNone;
  (__return_storage_ptr__->mError).mMessage._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mError).mMessage.field_2;
  (__return_storage_ptr__->mError).mMessage._M_string_length = 0;
  (__return_storage_ptr__->mError).mMessage.field_2._M_local_buf[0] = '\0';
  (__return_storage_ptr__->mData)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mData).field_2;
  (__return_storage_ptr__->mData)._M_string_length = 0;
  (__return_storage_ptr__->mData).field_2._M_local_buf[0] = '\0';
  local_a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  local_a8.super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  JobManager::GetSelectedCommissioner
            ((Error *)local_90,
             (this->mJobManager).
             super___shared_ptr<ot::commissioner::JobManager,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
             &local_a8);
  Value::Value((Value *)&stack0xffffffffffffff98,(Error *)local_90);
  this_00 = (Interpreter *)&stack0xffffffffffffff98;
  pVVar2 = Value::operator=(__return_storage_ptr__,(Value *)&stack0xffffffffffffff98);
  EVar1 = (pVVar2->mError).mCode;
  Value::~Value((Value *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string((string *)(local_90 + 8));
  if (EVar1 == kNone) {
    ProcessNetworkDiagJob((Value *)&stack0xffffffffffffff98,this_00,&local_a8,aExpr);
    Value::operator=(__return_storage_ptr__,(Value *)&stack0xffffffffffffff98);
    Value::~Value((Value *)&stack0xffffffffffffff98);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_a8.
              super___shared_ptr<ot::commissioner::CommissionerApp,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount);
  return __return_storage_ptr__;
}

Assistant:

Interpreter::Value Interpreter::ProcessNetworkDiag(const Expression &aExpr)
{
    Value              value;
    CommissionerAppPtr commissioner = nullptr;

    SuccessOrExit(value = mJobManager->GetSelectedCommissioner(commissioner));
    value = ProcessNetworkDiagJob(commissioner, aExpr);
exit:
    return value;
}